

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O0

void __thiscall LibClass::doSomething(LibClass *this)

{
  LibInternalClass *this_00;
  LibInternalClass *temp;
  int i;
  LibClass *this_local;
  
  for (temp._4_4_ = 0; temp._4_4_ < 0x14; temp._4_4_ = temp._4_4_ + 1) {
    this_00 = (LibInternalClass *)operator_new(8);
    LibInternalClass::LibInternalClass(this_00);
  }
  return;
}

Assistant:

void LibClass::doSomething() {
    for (int i = 0; i < 20; i++) {
        LibInternalClass* temp = new LibInternalClass();
    }
}